

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O0

void test_list_empty(void)

{
  int iVar1;
  LIST_NODE node;
  LIST list;
  LIST_NODE *in_stack_ffffffffffffffd8;
  LIST *in_stack_ffffffffffffffe0;
  LIST local_10;
  
  list_init(&local_10);
  iVar1 = list_is_empty(&local_10);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x3b,"%s","list_is_empty(&list)");
  list_append(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  iVar1 = list_is_empty(&local_10);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x3d,"%s","!list_is_empty(&list)");
  return;
}

Assistant:

static void
test_list_empty(void)
{
    LIST list;
    LIST_NODE node;

    list_init(&list);

    TEST_CHECK(list_is_empty(&list));
    list_append(&list, &node);
    TEST_CHECK(!list_is_empty(&list));
}